

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

void __thiscall glcts::StringStream::reset(StringStream *this)

{
  allocator<char> local_31;
  string local_30 [32];
  StringStream *local_10;
  StringStream *this_local;
  
  local_10 = this;
  std::ios::clear((_func_int *)
                  ((long)&(this->super_ostringstream).
                          super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream +
                  (long)(this->super_ostringstream).
                        super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]),
                  0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"",&local_31);
  std::__cxx11::ostringstream::str((string *)this);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void reset()
	{
		clear();
		str("");
	}